

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O0

void advance(YM2151 *PSG)

{
  uint uVar1;
  int local_2c;
  UINT32 kc_channel;
  INT32 mod_ind;
  UINT32 j;
  int p;
  int a;
  uint i;
  YM2151Operator *op;
  YM2151 *PSG_local;
  
  if ((PSG->test & 2) == 0) {
    PSG->lfo_timer = PSG->lfo_timer_add + PSG->lfo_timer;
    if (PSG->lfo_overflow <= PSG->lfo_timer) {
      PSG->lfo_timer = PSG->lfo_timer - PSG->lfo_overflow;
      PSG->lfo_counter = PSG->lfo_counter_add + PSG->lfo_counter;
      PSG->lfo_phase = (PSG->lfo_counter >> 4) + PSG->lfo_phase;
      PSG->lfo_phase = PSG->lfo_phase & 0xff;
      PSG->lfo_counter = PSG->lfo_counter & 0xf;
    }
  }
  else {
    PSG->lfo_phase = 0;
  }
  mod_ind = PSG->lfo_phase;
  switch(PSG->lfo_wsel) {
  case '\0':
    j = 0xff - mod_ind;
    if (0x7f < (uint)mod_ind) {
      mod_ind = mod_ind - 0xff;
    }
    break;
  case '\x01':
    if ((uint)mod_ind < 0x80) {
      j = 0xff;
      mod_ind = 0x80;
    }
    else {
      j = 0;
      mod_ind = -0x80;
    }
    break;
  case '\x02':
    if ((uint)mod_ind < 0x80) {
      j = mod_ind * -2 + 0xff;
    }
    else {
      j = mod_ind * 2 - 0x100;
    }
    if ((uint)mod_ind < 0x40) {
      mod_ind = mod_ind << 1;
    }
    else if ((uint)mod_ind < 0x80) {
      mod_ind = mod_ind * -2 + 0xff;
    }
    else if ((uint)mod_ind < 0xc0) {
      mod_ind = mod_ind * -2 + 0x100;
    }
    else {
      mod_ind = mod_ind * 2 + -0x1ff;
    }
    break;
  case '\x03':
  default:
    j = (UINT32)lfo_noise_waveform[(uint)mod_ind];
    mod_ind = j - 0x80;
  }
  PSG->lfa = (int)(j * PSG->amd) / 0x80;
  PSG->lfp = (mod_ind * PSG->pmd) / 0x80;
  PSG->noise_p = PSG->noise_f + PSG->noise_p;
  uVar1 = PSG->noise_p;
  PSG->noise_p = PSG->noise_p & 0xffff;
  for (p = uVar1 >> 0x10; p != 0; p = p + -1) {
    PSG->noise_rng = ((PSG->noise_rng ^ PSG->noise_rng >> 3) & 1 ^ 1) << 0x10 | PSG->noise_rng >> 1;
  }
  _a = PSG->oper;
  p = 8;
  do {
    if (_a->pms == 0) {
      _a->phase = _a->freq + _a->phase;
      _a[1].phase = _a[1].freq + _a[1].phase;
      _a[2].phase = _a[2].freq + _a[2].phase;
      _a[3].phase = _a[3].freq + _a[3].phase;
    }
    else {
      if (_a->pms < 6) {
        local_2c = PSG->lfp >> (6U - (char)_a->pms & 0x1f);
      }
      else {
        local_2c = PSG->lfp << ((char)_a->pms - 5U & 0x1f);
      }
      if (local_2c == 0) {
        _a->phase = _a->freq + _a->phase;
        _a[1].phase = _a[1].freq + _a[1].phase;
        _a[2].phase = _a[2].freq + _a[2].phase;
        _a[3].phase = _a[3].freq + _a[3].phase;
      }
      else {
        local_2c = _a->kc_i + local_2c;
        _a->phase = ((PSG->freq[local_2c + _a->dt2] + _a->dt1) * _a->mul >> 1) + _a->phase;
        _a[1].phase = ((PSG->freq[local_2c + _a[1].dt2] + _a[1].dt1) * _a[1].mul >> 1) + _a[1].phase
        ;
        _a[2].phase = ((PSG->freq[local_2c + _a[2].dt2] + _a[2].dt1) * _a[2].mul >> 1) + _a[2].phase
        ;
        _a[3].phase = ((PSG->freq[local_2c + _a[3].dt2] + _a[3].dt1) * _a[3].mul >> 1) + _a[3].phase
        ;
      }
    }
    _a = _a + 4;
    p = p + -1;
  } while (p != 0);
  if (PSG->csm_req != 0) {
    if (PSG->csm_req == 2) {
      _a = PSG->oper;
      p = 0x20;
      do {
        KEY_ON(_a,2,PSG->eg_cnt);
        _a = _a + 1;
        p = p + -1;
      } while (p != 0);
      PSG->csm_req = 1;
    }
    else {
      _a = PSG->oper;
      p = 0x20;
      do {
        KEY_OFF(_a,2);
        _a = _a + 1;
        p = p + -1;
      } while (p != 0);
      PSG->csm_req = 0;
    }
  }
  return;
}

Assistant:

INLINE void advance(YM2413 *chip)
{
	OPLL_CH *CH;
	OPLL_SLOT *op;
	unsigned int i;

	/* Envelope Generator */
	chip->eg_timer += chip->eg_timer_add;

	while (chip->eg_timer >= chip->eg_timer_overflow)
	{
		chip->eg_timer -= chip->eg_timer_overflow;

		chip->eg_cnt++;

		for (i=0; i<9*2; i++)
		{
			CH  = &chip->P_CH[i/2];

			op  = &CH->SLOT[i&1];

			switch(op->state)
			{
			case EG_DMP:        /* dump phase */
			/*dump phase is performed by both operators in each channel*/
			/*when CARRIER envelope gets down to zero level,
			**  phases in BOTH opearators are reset (at the same time ?)
			*/
				if ( !(chip->eg_cnt & ((1<<op->eg_sh_dp)-1) ) )
				{
					op->volume += eg_inc[op->eg_sel_dp + ((chip->eg_cnt>>op->eg_sh_dp)&7)];

					if ( op->volume >= MAX_ATT_INDEX )
					{
						op->volume = MAX_ATT_INDEX;
						op->state = EG_ATT;
						/* restart Phase Generator  */
						op->phase = 0;
					}
				}
			break;

			case EG_ATT:        /* attack phase */
				if ( !(chip->eg_cnt & ((1<<op->eg_sh_ar)-1) ) )
				{
					op->volume += (~op->volume *
												(eg_inc[op->eg_sel_ar + ((chip->eg_cnt>>op->eg_sh_ar)&7)])
												) >>2;

					if (op->volume <= MIN_ATT_INDEX)
					{
						op->volume = MIN_ATT_INDEX;
						op->state = EG_DEC;
					}
				}
			break;

			case EG_DEC:    /* decay phase */
				if ( !(chip->eg_cnt & ((1<<op->eg_sh_dr)-1) ) )
				{
					op->volume += eg_inc[op->eg_sel_dr + ((chip->eg_cnt>>op->eg_sh_dr)&7)];

					if ( op->volume >= (INT32)op->sl )
						op->state = EG_SUS;
				}
			break;

			case EG_SUS:    /* sustain phase */
				/* this is important behaviour:
				one can change percusive/non-percussive modes on the fly and
				the chip will remain in sustain phase - verified on real YM3812 */

				if(op->eg_type)     /* non-percussive mode (sustained tone) */
				{
									/* do nothing */
				}
				else                /* percussive mode */
				{
					/* during sustain phase chip adds Release Rate (in percussive mode) */
					if ( !(chip->eg_cnt & ((1<<op->eg_sh_rr)-1) ) )
					{
						op->volume += eg_inc[op->eg_sel_rr + ((chip->eg_cnt>>op->eg_sh_rr)&7)];

						if ( op->volume >= MAX_ATT_INDEX )
							op->volume = MAX_ATT_INDEX;
					}
					/* else do nothing in sustain phase */
				}
			break;

			case EG_REL:    /* release phase */
			/* exclude modulators in melody channels from performing anything in this mode*/
			/* allowed are only carriers in melody mode and rhythm slots in rhythm mode */

			/*This table shows which operators and on what conditions are allowed to perform EG_REL:
			(a) - always perform EG_REL
			(n) - never perform EG_REL
			(r) - perform EG_REL in Rhythm mode ONLY
			    0: 0 (n),  1 (a)
			    1: 2 (n),  3 (a)
			    2: 4 (n),  5 (a)
			    3: 6 (n),  7 (a)
			    4: 8 (n),  9 (a)
			    5: 10(n),  11(a)
			    6: 12(r),  13(a)
			    7: 14(r),  15(a)
			    8: 16(r),  17(a)
			*/
				if ( (i&1) || ((chip->rhythm&0x20) && (i>=12)) )/* exclude modulators */
				{
					if(op->eg_type)     /* non-percussive mode (sustained tone) */
					/*this is correct: use RR when SUS = OFF*/
					/*and use RS when SUS = ON*/
					{
						if (CH->sus)
						{
							if ( !(chip->eg_cnt & ((1<<op->eg_sh_rs)-1) ) )
							{
								op->volume += eg_inc[op->eg_sel_rs + ((chip->eg_cnt>>op->eg_sh_rs)&7)];
								if ( op->volume >= MAX_ATT_INDEX )
								{
									op->volume = MAX_ATT_INDEX;
									op->state = EG_OFF;
								}
							}
						}
						else
						{
							if ( !(chip->eg_cnt & ((1<<op->eg_sh_rr)-1) ) )
							{
								op->volume += eg_inc[op->eg_sel_rr + ((chip->eg_cnt>>op->eg_sh_rr)&7)];
								if ( op->volume >= MAX_ATT_INDEX )
								{
									op->volume = MAX_ATT_INDEX;
									op->state = EG_OFF;
								}
							}
						}
					}
					else                /* percussive mode */
					{
						if ( !(chip->eg_cnt & ((1<<op->eg_sh_rs)-1) ) )
						{
							op->volume += eg_inc[op->eg_sel_rs + ((chip->eg_cnt>>op->eg_sh_rs)&7)];
							if ( op->volume >= MAX_ATT_INDEX )
							{
								op->volume = MAX_ATT_INDEX;
								op->state = EG_OFF;
							}
						}
					}
				}
			break;

			default:
			break;
			}
		}
	}

	for (i=0; i<9*2; i++)
	{
		CH  = &chip->P_CH[i/2];
		op  = &CH->SLOT[i&1];

		/* Phase Generator */
		if(op->vib)
		{
			UINT8 block;

			unsigned int fnum_lfo   = 8*((CH->block_fnum&0x01c0) >> 6);
			unsigned int block_fnum = CH->block_fnum * 2;
			signed int lfo_fn_table_index_offset = lfo_pm_table[chip->LFO_PM + fnum_lfo ];

			if (lfo_fn_table_index_offset)  /* LFO phase modulation active */
			{
				block_fnum += lfo_fn_table_index_offset;
				block = (block_fnum&0x1c00) >> 10;
				op->phase += (chip->fn_tab[block_fnum&0x03ff] >> (7-block)) * op->mul;
			}
			else    /* LFO phase modulation  = zero */
			{
				op->phase += op->freq;
			}
		}
		else    /* LFO phase modulation disabled for this operator */
		{
			op->phase += op->freq;
		}
	}

	/*  The Noise Generator of the YM3812 is 23-bit shift register.
	*   Period is equal to 2^23-2 samples.
	*   Register works at sampling frequency of the chip, so output
	*   can change on every sample.
	*
	*   Output of the register and input to the bit 22 is:
	*   bit0 XOR bit14 XOR bit15 XOR bit22
	*
	*   Simply use bit 22 as the noise output.
	*/

	chip->noise_p += chip->noise_f;
	i = chip->noise_p >> FREQ_SH;       /* number of events (shifts of the shift register) */
	chip->noise_p &= FREQ_MASK;
	while (i)
	{
		/*
		UINT32 j;
		j = ( (chip->noise_rng) ^ (chip->noise_rng>>14) ^ (chip->noise_rng>>15) ^ (chip->noise_rng>>22) ) & 1;
		chip->noise_rng = (j<<22) | (chip->noise_rng>>1);
		*/

		/*
		    Instead of doing all the logic operations above, we
		    use a trick here (and use bit 0 as the noise output).
		    The difference is only that the noise bit changes one
		    step ahead. This doesn't matter since we don't know
		    what is real state of the noise_rng after the reset.
		*/

		if (chip->noise_rng & 1) chip->noise_rng ^= 0x800302;
		chip->noise_rng >>= 1;

		i--;
	}
}